

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O0

void __thiscall Assimp::XFileParser::GetNextTokenAsString(XFileParser *this,string *poString)

{
  Scene *pSVar1;
  char *pcVar2;
  bool bVar3;
  allocator local_e1;
  string local_e0;
  allocator local_b9;
  string local_b8;
  allocator local_91;
  string local_90;
  allocator local_59;
  string local_58;
  string local_38;
  string *local_18;
  string *poString_local;
  XFileParser *this_local;
  
  local_18 = poString;
  poString_local = (string *)this;
  if ((this->mIsBinaryFormat & 1U) == 0) {
    FindNextNoneWhiteSpace(this);
    if (this->mEnd <= this->mP) {
      pSVar1 = this->mScene;
      if (pSVar1 != (Scene *)0x0) {
        XFile::Scene::~Scene(pSVar1);
        operator_delete(pSVar1);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_58,"Unexpected end of file while parsing string",&local_59);
      ThrowException(this,&local_58);
    }
    if (*this->mP != '\"') {
      pSVar1 = this->mScene;
      if (pSVar1 != (Scene *)0x0) {
        XFile::Scene::~Scene(pSVar1);
        operator_delete(pSVar1);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_90,"Expected quotation mark.",&local_91);
      ThrowException(this,&local_90);
    }
    this->mP = this->mP + 1;
    while( true ) {
      bVar3 = false;
      if (this->mP < this->mEnd) {
        bVar3 = *this->mP != '\"';
      }
      if (!bVar3) break;
      pcVar2 = this->mP;
      this->mP = pcVar2 + 1;
      std::__cxx11::string::append((char *)local_18,(ulong)pcVar2);
    }
    if (this->mEnd + -1 <= this->mP) {
      pSVar1 = this->mScene;
      if (pSVar1 != (Scene *)0x0) {
        XFile::Scene::~Scene(pSVar1);
        operator_delete(pSVar1);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_b8,"Unexpected end of file while parsing string",&local_b9);
      ThrowException(this,&local_b8);
    }
    if ((this->mP[1] != ';') || (*this->mP != '\"')) {
      pSVar1 = this->mScene;
      if (pSVar1 != (Scene *)0x0) {
        XFile::Scene::~Scene(pSVar1);
        operator_delete(pSVar1);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_e0,"Expected quotation mark and semicolon at the end of a string."
                 ,&local_e1);
      ThrowException(this,&local_e0);
    }
    this->mP = this->mP + 2;
  }
  else {
    GetNextToken_abi_cxx11_(&local_38,this);
    std::__cxx11::string::operator=((string *)local_18,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void XFileParser::GetNextTokenAsString( std::string& poString)
{
    if( mIsBinaryFormat)
    {
        poString = GetNextToken();
        return;
    }

    FindNextNoneWhiteSpace();
    if ( mP >= mEnd ) {
        delete mScene;
        ThrowException( "Unexpected end of file while parsing string" );
    }

    if ( *mP != '"' ) {
        delete mScene;
        ThrowException( "Expected quotation mark." );
    }
    ++mP;

    while( mP < mEnd && *mP != '"')
        poString.append( mP++, 1);

    if ( mP >= mEnd - 1 ) {
        delete mScene;
        ThrowException( "Unexpected end of file while parsing string" );
    }

    if ( mP[ 1 ] != ';' || mP[ 0 ] != '"' ) {
        delete mScene;
        ThrowException( "Expected quotation mark and semicolon at the end of a string." );
    }
    mP+=2;
}